

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void reg_reg12_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t address_00;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  uint8_t regs;
  byte local_19 [9];
  m680x_info *local_10;
  
  local_19[0] = 0;
  address_00 = *in_RDX;
  *in_RDX = address_00 + 1;
  local_10 = in_RSI;
  read_byte(in_RSI,local_19,address_00);
  if ((local_19[0] & 0x80) == 0) {
    local_10->insn = M680X_INS_TFR;
  }
  else {
    local_10->insn = M680X_INS_EXG;
  }
  add_reg_operand(local_10,reg_reg12_hdlr::g_tfr_exg12_reg0_ids
                           [(int)((int)(uint)local_19[0] >> 4 & 7)]);
  add_reg_operand(local_10,reg_reg12_hdlr::g_tfr_exg12_reg1_ids[(int)(local_19[0] & 7)]);
  return;
}

Assistant:

static void reg_reg12_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const m680x_reg g_tfr_exg12_reg0_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP3,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	static const m680x_reg g_tfr_exg12_reg1_ids[] = {
		M680X_REG_A, M680X_REG_B,  M680X_REG_CC,  M680X_REG_TMP2,
		M680X_REG_D, M680X_REG_X, M680X_REG_Y,  M680X_REG_S,
	};
	uint8_t regs = 0;

	read_byte(info, &regs, (*address)++);

	// The opcode of this instruction depends on
	// the msb of its post byte.
	if (regs & 0x80)
		info->insn = M680X_INS_EXG;
	else
		info->insn = M680X_INS_TFR;

	add_reg_operand(info, g_tfr_exg12_reg0_ids[(regs >> 4) & 0x07]);
	add_reg_operand(info, g_tfr_exg12_reg1_ids[regs & 0x07]);
}